

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftwareRenderer.hpp
# Opt level: O2

Image4u * __thiscall
eos::render::SoftwareRenderer<eos::render::VertexShader,_eos::render::VertexColoringFragmentShader>
::render<float>(Image4u *__return_storage_ptr__,
               SoftwareRenderer<eos::render::VertexShader,_eos::render::VertexColoringFragmentShader>
               *this,Mesh *mesh,Matrix4<float> *model_view_matrix,Matrix4<float> *projection_matrix,
               optional<eos::render::Texture> *texture)

{
  pointer paVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  pointer paVar9;
  pointer pMVar10;
  pointer pMVar11;
  pointer pMVar12;
  pointer pMVar13;
  pointer paVar14;
  Image4u *pIVar15;
  optional<eos::render::Texture> *texture_00;
  uint uVar16;
  long lVar17;
  uchar k;
  pointer paVar18;
  Vertex<float> *point_a;
  ulong uVar19;
  char *__assertion;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  uint uVar24;
  Matrix<float,_3,_1,_0,_3,_1> *vertex_position;
  float *pfVar25;
  float fVar26;
  Rect<int> RVar27;
  uchar visibility_bits [3];
  array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> prospective_tri;
  long local_170;
  vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
  vertices;
  plain_array<float,_2,_0,_0> local_148;
  Vector2<float> v2_screen_1;
  Vector2<float> v2_screen;
  Vector2<float> v1_screen;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  clipspace_vertices;
  vector<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
  triangles_to_raster;
  undefined1 local_e8 [16];
  pointer local_d8;
  float local_d0;
  plain_array<float,_2,_0,_0> local_cc;
  float local_b8 [2];
  float afStack_b0 [2];
  float local_a8 [3];
  DenseStorage<float,_2,_2,_1,_0> local_9c;
  float local_88 [2];
  float afStack_80 [2];
  float local_78 [3];
  DenseStorage<float,_2,_2,_1,_0> local_6c;
  Image4u *local_58;
  optional<eos::render::Texture> *local_50;
  pointer local_48;
  pointer local_40;
  plain_array<float,_2,_0,_0> local_38;
  
  pfVar25 = (float *)(mesh->vertices).
                     super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  paVar9 = (pointer)(mesh->vertices).
                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  lVar17 = (long)paVar9 - (long)pfVar25;
  pMVar10 = (mesh->colors).
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pMVar11 = (mesh->colors).
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (lVar17 == (long)pMVar10 - (long)pMVar11 || pMVar10 == pMVar11) {
    pMVar12 = (mesh->texcoords).
              super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar13 = (mesh->texcoords).
              super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    paVar14 = (mesh->tti).
              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    paVar18 = (mesh->tti).
              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((lVar17 / 0xc == (long)pMVar13 - (long)pMVar12 >> 3) ||
       (pMVar12 == pMVar13 || paVar14 != paVar18)) {
      if ((paVar14 == paVar18) ||
         ((long)paVar18 - (long)paVar14 ==
          (long)(mesh->tvi).
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(mesh->tvi).
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start)) {
        local_58 = __return_storage_ptr__;
        if ((pMVar13 != pMVar12) ||
           ((texture->super__Optional_base<eos::render::Texture,_false,_false>)._M_payload.
            super__Optional_payload<eos::render::Texture,_true,_false,_false>.
            super__Optional_payload_base<eos::render::Texture>._M_engaged == false)) {
          clipspace_vertices.
          super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          clipspace_vertices.
          super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          clipspace_vertices.
          super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_50 = texture;
          for (; (pointer)pfVar25 != paVar9; pfVar25 = pfVar25 + 3) {
            triangles_to_raster.
            super__Vector_base<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pfVar25;
            Eigen::PlainObjectBase<Eigen::Matrix<float,4,1,0,4,1>>::
            _set_noalias<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>>
                      ((PlainObjectBase<Eigen::Matrix<float,4,1,0,4,1>> *)&prospective_tri,
                       (DenseBase<Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>_> *)
                       &triangles_to_raster);
            VertexShader::operator()
                      ((VertexShader *)local_e8,(Vector4<float> *)&this->field_0x90,
                       (Matrix4<float> *)&prospective_tri,model_view_matrix);
            std::
            vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>::
            emplace_back<Eigen::Matrix<float,4,1,0,4,1>>
                      ((vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>
                        *)&clipspace_vertices,(Matrix<float,_4,_1,_0,_4,_1> *)local_e8);
          }
          triangles_to_raster.
          super__Vector_base<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          triangles_to_raster.
          super__Vector_base<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          triangles_to_raster.
          super__Vector_base<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_40 = (mesh->tti).
                     super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          local_48 = (mesh->tti).
                     super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          local_170 = 0;
          for (uVar19 = 0; texture_00 = local_50,
              paVar9 = triangles_to_raster.
                       super__Vector_base<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
              paVar14 = (mesh->tvi).
                        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              uVar19 < (ulong)(((long)(mesh->tvi).
                                      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)paVar14) /
                              0xc); uVar19 = uVar19 + 1) {
            paVar18 = paVar14;
            if (local_40 != local_48) {
              paVar18 = (mesh->tti).
                        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            paVar1 = paVar14 + uVar19;
            bVar6 = this->enable_near_clipping;
            bVar7 = (this->rasterizer).enable_far_clipping;
            for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
              visibility_bits[lVar17] = '\0';
              iVar8 = *(int *)((long)paVar14->_M_elems + lVar17 * 4 + local_170);
              fVar2 = clipspace_vertices.
                      super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar8].
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array[2];
              fVar3 = clipspace_vertices.
                      super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar8].
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array[3];
              fVar26 = -fVar3;
              fVar4 = clipspace_vertices.
                      super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar8].
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array[0];
              bVar21 = fVar2 < fVar26 & bVar6;
              fVar5 = clipspace_vertices.
                      super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar8].
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array[1];
              bVar20 = fVar3 < fVar2 & bVar7;
              if (((((fVar4 < fVar26) || (fVar3 < fVar4)) || (fVar5 < fVar26)) ||
                  ((fVar3 < fVar5 || (bVar21 != 0)))) || (bVar20 != 0)) {
                bVar23 = (fVar4 < fVar26) + 2;
                if (fVar4 <= fVar3) {
                  bVar23 = fVar4 < fVar26;
                }
                bVar22 = bVar23 + 4;
                if (fVar26 <= fVar5) {
                  bVar22 = bVar23;
                }
                bVar23 = bVar22 | 8;
                if (fVar5 <= fVar3) {
                  bVar23 = bVar22;
                }
                bVar22 = bVar23 | 0x10;
                if (bVar21 == 0) {
                  bVar22 = bVar23;
                }
                bVar21 = bVar22 | 0x20;
                if (bVar20 == 0) {
                  bVar21 = bVar22;
                }
                visibility_bits[lVar17] = bVar21;
              }
            }
            if ((visibility_bits[1] & visibility_bits[0] & visibility_bits[2]) == 0) {
              paVar18 = paVar18 + uVar19;
              if ((visibility_bits[1] == '\0' && visibility_bits[0] == '\0') &&
                  visibility_bits[2] == '\0') {
                detail::divide_by_w<float>
                          ((detail *)&prospective_tri,
                           clipspace_vertices.
                           super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + paVar1->_M_elems[0]);
                detail::divide_by_w<float>
                          ((detail *)(prospective_tri._M_elems + 1),
                           clipspace_vertices.
                           super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + paVar1->_M_elems[1]);
                detail::divide_by_w<float>
                          ((detail *)(prospective_tri._M_elems + 2),
                           clipspace_vertices.
                           super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + paVar1->_M_elems[2]);
                clip_to_screen_space<float>
                          ((render *)&vertices,
                           prospective_tri._M_elems[0].
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[0],
                           prospective_tri._M_elems[0].
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[1],(this->rasterizer).viewport_width,
                           (this->rasterizer).viewport_height);
                prospective_tri._M_elems[0].
                super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array.
                _0_8_ = vertices.
                        super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
                clip_to_screen_space<float>
                          ((render *)&v1_screen,
                           prospective_tri._M_elems[1].
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[0],
                           prospective_tri._M_elems[1].
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[1],(this->rasterizer).viewport_width,
                           (this->rasterizer).viewport_height);
                prospective_tri._M_elems[1].
                super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array.
                _0_8_ = v1_screen.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                        m_storage.m_data.array;
                clip_to_screen_space<float>
                          ((render *)&v2_screen,
                           prospective_tri._M_elems[2].
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[0],
                           prospective_tri._M_elems[2].
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[1],(this->rasterizer).viewport_width,
                           (this->rasterizer).viewport_height);
                prospective_tri._M_elems[2].
                super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array.
                _0_8_ = v2_screen.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                        m_storage.m_data.array;
                if ((this->enable_backface_culling != true) ||
                   ((v2_screen.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage
                     .m_data.array[1] -
                    prospective_tri._M_elems[0].
                    super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array[1]) *
                    (prospective_tri._M_elems[1].
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                     array[0] -
                    prospective_tri._M_elems[0].
                    super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array[0]) -
                    (v2_screen.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage
                     .m_data.array[0] -
                    prospective_tri._M_elems[0].
                    super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array[0]) *
                    (prospective_tri._M_elems[1].
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                     array[1] -
                    prospective_tri._M_elems[0].
                    super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array[1]) < 0.0)) {
                  local_e8._0_4_ =
                       prospective_tri._M_elems[0].
                       super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                       array[0];
                  local_e8._4_4_ =
                       prospective_tri._M_elems[0].
                       super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                       array[1];
                  v2_screen_1.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
                  m_data.array = (PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>)
                                 (PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>)
                                 prospective_tri._M_elems[1].
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data.array._0_8_;
                  local_148.array =
                       (float  [2])
                       v2_screen.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                       m_storage.m_data.array;
                  RVar27 = detail::calculate_clipped_bounding_box<float>
                                     ((Vector2<float> *)local_e8,&v2_screen_1,
                                      (Vector2<float> *)&local_148,(this->rasterizer).viewport_width
                                      ,(this->rasterizer).viewport_height);
                  if (0 < RVar27.width && (RVar27.height != 0 && -1 < RVar27._8_8_)) {
                    local_e8._0_4_ =
                         prospective_tri._M_elems[0].
                         super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array[0];
                    local_e8._4_4_ =
                         prospective_tri._M_elems[0].
                         super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array[1];
                    local_e8._8_4_ =
                         prospective_tri._M_elems[0].
                         super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array[2];
                    local_e8._12_4_ =
                         prospective_tri._M_elems[0].
                         super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array[3];
                    pMVar10 = (mesh->colors).
                              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    pMVar11 = (mesh->colors).
                              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    if (pMVar11 == pMVar10) {
                      local_d8 = (pointer)0x0;
                      local_d0 = 0.0;
                    }
                    else {
                      local_d0 = pMVar10[paVar1->_M_elems[0]].
                                 super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[2];
                      local_d8 = *(pointer *)
                                  pMVar10[paVar1->_M_elems[0]].
                                  super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array;
                    }
                    pMVar12 = (mesh->texcoords).
                              super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    local_cc.array[1] =
                         *(float *)((long)&pMVar12[paVar18->_M_elems[0]].
                                           super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>
                                           .m_storage.m_data + 4);
                    local_cc.array[0] =
                         pMVar12[paVar18->_M_elems[0]].
                         super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
                         m_data.array[0];
                    local_b8[0] = prospective_tri._M_elems[1].
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                                  m_storage.m_data.array[0];
                    local_b8[1] = prospective_tri._M_elems[1].
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                                  m_storage.m_data.array[1];
                    afStack_b0[0] =
                         prospective_tri._M_elems[1].
                         super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array[2];
                    afStack_b0[1] =
                         prospective_tri._M_elems[1].
                         super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array[3];
                    if (pMVar11 == pMVar10) {
                      local_a8[0] = 0.0;
                      local_a8[1] = 0.0;
                      local_a8[2] = 0.0;
                    }
                    else {
                      local_a8[2] = pMVar10[paVar1->_M_elems[1]].
                                    super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array[2];
                      local_a8._0_8_ =
                           *(undefined8 *)
                            pMVar10[paVar1->_M_elems[1]].
                            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array;
                    }
                    local_9c.m_data.array[1] =
                         *(float *)((long)&pMVar12[paVar18->_M_elems[1]].
                                           super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>
                                           .m_storage.m_data + 4);
                    local_9c.m_data.array[0] =
                         pMVar12[paVar18->_M_elems[1]].
                         super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
                         m_data.array[0];
                    local_88[0] = prospective_tri._M_elems[2].
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                                  m_storage.m_data.array[0];
                    local_88[1] = prospective_tri._M_elems[2].
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                                  m_storage.m_data.array[1];
                    afStack_80[0] =
                         prospective_tri._M_elems[2].
                         super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array[2];
                    afStack_80[1] =
                         prospective_tri._M_elems[2].
                         super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array[3];
                    if (pMVar11 == pMVar10) {
                      local_78[0] = 0.0;
                      local_78[1] = 0.0;
                      local_78[2] = 0.0;
                    }
                    else {
                      local_78[2] = pMVar10[paVar1->_M_elems[2]].
                                    super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array[2];
                      local_78._0_8_ =
                           *(undefined8 *)
                            pMVar10[paVar1->_M_elems[2]].
                            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array;
                    }
                    local_6c.m_data.array[1] =
                         *(float *)((long)&pMVar12[paVar18->_M_elems[2]].
                                           super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>
                                           .m_storage.m_data + 4);
                    local_6c.m_data.array[0] =
                         pMVar12[paVar18->_M_elems[2]].
                         super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
                         m_data.array[0];
                    std::
                    vector<std::array<eos::render::detail::Vertex<float>,3ul>,std::allocator<std::array<eos::render::detail::Vertex<float>,3ul>>>
                    ::emplace_back<std::array<eos::render::detail::Vertex<float>,3ul>>
                              ((vector<std::array<eos::render::detail::Vertex<float>,3ul>,std::allocator<std::array<eos::render::detail::Vertex<float>,3ul>>>
                                *)&triangles_to_raster,
                               (array<eos::render::detail::Vertex<float>,_3UL> *)local_e8);
                  }
                }
              }
              else {
                vertices.
                super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                vertices.
                super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                vertices.
                super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::
                vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                ::reserve(&vertices,3);
                local_e8._0_8_ =
                     *(undefined8 *)
                      clipspace_vertices.
                      super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[paVar1->_M_elems[0]].
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array;
                local_e8._8_8_ =
                     *(undefined8 *)
                      (clipspace_vertices.
                       super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[paVar1->_M_elems[0]].
                       super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                       array + 2);
                pMVar10 = (mesh->colors).
                          super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if ((mesh->colors).
                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish == pMVar10) {
                  local_d8 = (pointer)0x0;
                  local_d0 = 0.0;
                }
                else {
                  local_d0 = pMVar10[paVar1->_M_elems[0]].
                             super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data.array[2];
                  local_d8 = *(pointer *)
                              pMVar10[paVar1->_M_elems[0]].
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                              m_data.array;
                }
                pMVar12 = (mesh->texcoords).
                          super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_cc.array[1] =
                     *(float *)((long)&pMVar12[paVar18->_M_elems[0]].
                                       super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                       m_storage.m_data + 4);
                local_cc.array[0] =
                     pMVar12[paVar18->_M_elems[0]].
                     super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                     array[0];
                std::
                vector<eos::render::detail::Vertex<float>,std::allocator<eos::render::detail::Vertex<float>>>
                ::emplace_back<eos::render::detail::Vertex<float>>
                          ((vector<eos::render::detail::Vertex<float>,std::allocator<eos::render::detail::Vertex<float>>>
                            *)&vertices,(Vertex<float> *)local_e8);
                local_e8._0_8_ =
                     *(undefined8 *)
                      clipspace_vertices.
                      super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[paVar1->_M_elems[1]].
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array;
                local_e8._8_8_ =
                     *(undefined8 *)
                      (clipspace_vertices.
                       super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[paVar1->_M_elems[1]].
                       super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                       array + 2);
                pMVar10 = (mesh->colors).
                          super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if ((mesh->colors).
                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish == pMVar10) {
                  local_d8 = (pointer)0x0;
                  local_d0 = 0.0;
                }
                else {
                  local_d0 = pMVar10[paVar1->_M_elems[1]].
                             super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data.array[2];
                  local_d8 = *(pointer *)
                              pMVar10[paVar1->_M_elems[1]].
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                              m_data.array;
                }
                pMVar12 = (mesh->texcoords).
                          super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_cc.array[1] =
                     *(float *)((long)&pMVar12[paVar18->_M_elems[1]].
                                       super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                       m_storage.m_data + 4);
                local_cc.array[0] =
                     pMVar12[paVar18->_M_elems[1]].
                     super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                     array[0];
                std::
                vector<eos::render::detail::Vertex<float>,std::allocator<eos::render::detail::Vertex<float>>>
                ::emplace_back<eos::render::detail::Vertex<float>>
                          ((vector<eos::render::detail::Vertex<float>,std::allocator<eos::render::detail::Vertex<float>>>
                            *)&vertices,(Vertex<float> *)local_e8);
                local_e8._0_8_ =
                     *(undefined8 *)
                      clipspace_vertices.
                      super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[paVar1->_M_elems[2]].
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                      array;
                local_e8._8_8_ =
                     *(undefined8 *)
                      (clipspace_vertices.
                       super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[paVar1->_M_elems[2]].
                       super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                       array + 2);
                pMVar10 = (mesh->colors).
                          super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if ((mesh->colors).
                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish == pMVar10) {
                  local_d8 = (pointer)0x0;
                  local_d0 = 0.0;
                }
                else {
                  local_d0 = pMVar10[paVar1->_M_elems[2]].
                             super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data.array[2];
                  local_d8 = *(pointer *)
                              pMVar10[paVar1->_M_elems[2]].
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                              m_data.array;
                }
                pMVar12 = (mesh->texcoords).
                          super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_cc.array[1] =
                     *(float *)((long)&pMVar12[paVar18->_M_elems[2]].
                                       super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                       m_storage.m_data + 4);
                local_cc.array[0] =
                     pMVar12[paVar18->_M_elems[2]].
                     super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                     array[0];
                std::
                vector<eos::render::detail::Vertex<float>,std::allocator<eos::render::detail::Vertex<float>>>
                ::emplace_back<eos::render::detail::Vertex<float>>
                          ((vector<eos::render::detail::Vertex<float>,std::allocator<eos::render::detail::Vertex<float>>>
                            *)&vertices,(Vertex<float> *)local_e8);
                if (this->enable_near_clipping == true) {
                  prospective_tri._M_elems[0].
                  super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                  [0] = 0.0;
                  prospective_tri._M_elems[0].
                  super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                  [1] = 0.0;
                  prospective_tri._M_elems[0].
                  super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                  [2] = -1.0;
                  prospective_tri._M_elems[0].
                  super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                  [3] = -1.0;
                  detail::clip_polygon_to_plane_in_4d
                            ((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                              *)local_e8,&vertices,prospective_tri._M_elems);
                  std::
                  vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                  ::_M_move_assign(&vertices,
                                   (_Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                    *)local_e8);
                  std::
                  _Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                  ::~_Vector_base((_Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                   *)local_e8);
                }
                if (2 < (ulong)(((long)vertices.
                                       super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)vertices.
                                      super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x30)) {
                  for (bVar20 = 0;
                      (ulong)bVar20 <
                      ((long)vertices.
                             super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)vertices.
                            super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x30 - 2U;
                      bVar20 = bVar20 + 1) {
                    detail::divide_by_w<float>
                              ((detail *)&prospective_tri,
                               &(vertices.
                                 super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->position);
                    uVar16 = bVar20 + 1;
                    detail::divide_by_w<float>
                              ((detail *)(prospective_tri._M_elems + 1),
                               &vertices.
                                super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar16].position);
                    uVar24 = bVar20 + 2;
                    detail::divide_by_w<float>
                              ((detail *)(prospective_tri._M_elems + 2),
                               &vertices.
                                super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar24].position);
                    clip_to_screen_space<float>
                              ((render *)&v1_screen,
                               prospective_tri._M_elems[0].
                               super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage
                               .m_data.array[0],
                               prospective_tri._M_elems[0].
                               super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage
                               .m_data.array[1],(this->rasterizer).viewport_width,
                               (this->rasterizer).viewport_height);
                    prospective_tri._M_elems[0].
                    super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array._0_8_ = v1_screen.
                                  super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                  m_storage.m_data.array;
                    clip_to_screen_space<float>
                              ((render *)&v2_screen,
                               prospective_tri._M_elems[1].
                               super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage
                               .m_data.array[0],
                               prospective_tri._M_elems[1].
                               super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage
                               .m_data.array[1],(this->rasterizer).viewport_width,
                               (this->rasterizer).viewport_height);
                    prospective_tri._M_elems[1].
                    super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array._0_8_ = v2_screen.
                                  super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                  m_storage.m_data.array;
                    clip_to_screen_space<float>
                              ((render *)&v2_screen_1,
                               prospective_tri._M_elems[2].
                               super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage
                               .m_data.array[0],
                               prospective_tri._M_elems[2].
                               super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage
                               .m_data.array[1],(this->rasterizer).viewport_width,
                               (this->rasterizer).viewport_height);
                    prospective_tri._M_elems[2].
                    super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array._0_8_ = v2_screen_1.
                                  super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                  m_storage.m_data.array;
                    if ((this->enable_backface_culling != true) ||
                       ((v2_screen_1.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                         m_storage.m_data.array[1] -
                        prospective_tri._M_elems[0].
                        super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
                        .array[1]) *
                        (prospective_tri._M_elems[1].
                         super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array[0] -
                        prospective_tri._M_elems[0].
                        super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
                        .array[0]) -
                        (v2_screen_1.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                         m_storage.m_data.array[0] -
                        prospective_tri._M_elems[0].
                        super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
                        .array[0]) *
                        (prospective_tri._M_elems[1].
                         super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array[1] -
                        prospective_tri._M_elems[0].
                        super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
                        .array[1]) < 0.0)) {
                      local_e8._0_4_ =
                           prospective_tri._M_elems[0].
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[0];
                      local_e8._4_4_ =
                           prospective_tri._M_elems[0].
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[1];
                      local_148.array[0] =
                           prospective_tri._M_elems[1].
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[0];
                      local_148.array[1] =
                           prospective_tri._M_elems[1].
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[1];
                      local_38.array =
                           (float  [2])
                           v2_screen_1.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                           m_storage.m_data.array;
                      RVar27 = detail::calculate_clipped_bounding_box<float>
                                         ((Vector2<float> *)local_e8,(Vector2<float> *)&local_148,
                                          (Vector2<float> *)&local_38,
                                          (this->rasterizer).viewport_width,
                                          (this->rasterizer).viewport_height);
                      if (0 < RVar27.width && (RVar27.height != 0 && -1 < RVar27._8_8_)) {
                        local_e8._0_4_ =
                             prospective_tri._M_elems[0].
                             super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data.array[0];
                        local_e8._4_4_ =
                             prospective_tri._M_elems[0].
                             super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data.array[1];
                        local_e8._8_4_ =
                             prospective_tri._M_elems[0].
                             super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data.array[2];
                        local_e8._12_4_ =
                             prospective_tri._M_elems[0].
                             super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data.array[3];
                        local_d0 = ((vertices.
                                     super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->color).
                                   super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                                   m_storage.m_data.array[2];
                        local_d8 = *(pointer *)
                                    ((vertices.
                                      super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->color).
                                    super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array;
                        local_cc.array =
                             *&((vertices.
                                 super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->texcoords).
                               super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage
                               .m_data.array;
                        local_b8[0] = prospective_tri._M_elems[1].
                                      super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                                      m_storage.m_data.array[0];
                        local_b8[1] = prospective_tri._M_elems[1].
                                      super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                                      m_storage.m_data.array[1];
                        afStack_b0[0] =
                             prospective_tri._M_elems[1].
                             super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data.array[2];
                        afStack_b0[1] =
                             prospective_tri._M_elems[1].
                             super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data.array[3];
                        local_a8[2] = vertices.
                                      super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar16].color.
                                      super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                                      m_storage.m_data.array[2];
                        local_a8._0_8_ =
                             *(undefined8 *)
                              vertices.
                              super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar16].color.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                              m_data.array;
                        local_9c.m_data.array =
                             *(plain_array<float,_2,_0,_0> *)
                              vertices.
                              super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar16].texcoords.
                              super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
                              m_data.array;
                        local_88[0] = prospective_tri._M_elems[2].
                                      super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                                      m_storage.m_data.array[0];
                        local_88[1] = prospective_tri._M_elems[2].
                                      super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                                      m_storage.m_data.array[1];
                        afStack_80[0] =
                             prospective_tri._M_elems[2].
                             super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data.array[2];
                        afStack_80[1] =
                             prospective_tri._M_elems[2].
                             super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data.array[3];
                        local_78[2] = vertices.
                                      super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar24].color.
                                      super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                                      m_storage.m_data.array[2];
                        local_78._0_8_ =
                             *(undefined8 *)
                              vertices.
                              super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar24].color.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                              m_data.array;
                        local_6c.m_data.array =
                             *(plain_array<float,_2,_0,_0> *)
                              vertices.
                              super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar24].texcoords.
                              super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
                              m_data.array;
                        std::
                        vector<std::array<eos::render::detail::Vertex<float>,3ul>,std::allocator<std::array<eos::render::detail::Vertex<float>,3ul>>>
                        ::emplace_back<std::array<eos::render::detail::Vertex<float>,3ul>>
                                  ((vector<std::array<eos::render::detail::Vertex<float>,3ul>,std::allocator<std::array<eos::render::detail::Vertex<float>,3ul>>>
                                    *)&triangles_to_raster,
                                   (array<eos::render::detail::Vertex<float>,_3UL> *)local_e8);
                      }
                    }
                  }
                }
                std::
                _Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                ::~_Vector_base((_Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                 *)&vertices);
              }
            }
            local_170 = local_170 + 0xc;
          }
          for (point_a = (triangles_to_raster.
                          super__Vector_base<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_elems; pIVar15 = local_58,
              point_a != paVar9->_M_elems; point_a = point_a + 3) {
            Rasterizer<eos::render::VertexColoringFragmentShader>::raster_triangle<float>
                      (&this->rasterizer,point_a,point_a + 1,point_a + 2,texture_00);
          }
          core::Image<eos::core::Pixel<unsigned_char,_4>_>::Image
                    (local_58,&(this->rasterizer).colorbuffer);
          std::
          _Vector_base<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
          ::~_Vector_base(&triangles_to_raster.
                           super__Vector_base<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
                         );
          std::
          _Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
          ::~_Vector_base(&clipspace_vertices.
                           super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                         );
          return pIVar15;
        }
        __assertion = "!texture.has_value() || (texture.has_value() && mesh.texcoords.size() > 0)";
        uVar16 = 0x75;
      }
      else {
        __assertion = "mesh.tti.empty() || mesh.tti.size() == mesh.tvi.size()";
        uVar16 = 0x72;
      }
    }
    else {
      __assertion = 
      "mesh.vertices.size() == mesh.texcoords.size() || ((mesh.vertices.size() != mesh.texcoords.size()) && !mesh.tti.empty()) || mesh.texcoords.empty()"
      ;
      uVar16 = 0x70;
    }
  }
  else {
    __assertion = "mesh.vertices.size() == mesh.colors.size() || mesh.colors.empty()";
    uVar16 = 0x68;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/render/SoftwareRenderer.hpp"
                ,uVar16,
                "core::Image4u eos::render::SoftwareRenderer<eos::render::VertexShader, eos::render::VertexColoringFragmentShader>::render(const core::Mesh &, const Eigen::Matrix4<T> &, const Eigen::Matrix4<T> &, const cpp17::optional<Texture> &) [VertexShaderType = eos::render::VertexShader, FragmentShaderType = eos::render::VertexColoringFragmentShader, T = float]"
               );
}

Assistant:

core::Image4u render(const core::Mesh& mesh, const Eigen::Matrix4<T>& model_view_matrix,
                         const Eigen::Matrix4<T>& projection_matrix,
                         const cpp17::optional<Texture>& texture = cpp17::nullopt)
    {
        // The number of vertices has to be equal for both shape and colour, or, alternatively, it has to be a
        // shape-only model:
        assert(mesh.vertices.size() == mesh.colors.size() || mesh.colors.empty());
        // Make sure one of these three things is true:
        //  a) There are texture coordinates given for each vertex (the texture map doesn't contain any seams)
        //  b) A different number of tex coords and vertices (i.e. the texture map contains seams): A separate
        //     list of texture triangle indices has to be given (i.e. mesh.tti is not empty)
        //  c) There are no texture coordinates given (i.e. rendering without texture).
        assert(mesh.vertices.size() == mesh.texcoords.size() ||
               ((mesh.vertices.size() != mesh.texcoords.size()) && !mesh.tti.empty()) ||
               mesh.texcoords.empty());
        // Sanity check on the texture triangle indices: They should be either empty or equal to tvi.size():
        assert(mesh.tti.empty() || mesh.tti.size() == mesh.tvi.size());
        // Make sure either no texture is given, or a texture and texture coords:
        // (Potential todo: Is there a texturing flag we should check for too?)
        assert(!texture.has_value() || (texture.has_value() && mesh.texcoords.size() > 0));

        using detail::divide_by_w;
        using std::vector;

        vector<Eigen::Vector4<T>> clipspace_vertices;
        for (const auto& vertex_position : mesh.vertices)
        {
            // Note: We make an unnecessary copy of the vertex_position here. We could perhaps improve this by
            // using vertex_shader.operator()<vertex_type, T>(...). We're also making vertex_position the same
            // type as the matrix here, which we wouldn't necessarily need to, as VertexShader supports a
            // VertexType and MatrixType.
            clipspace_vertices.push_back(
                vertex_shader(Eigen::Vector4<T>(vertex_position.homogeneous()), model_view_matrix, projection_matrix));
            // Note: if mesh.colors.empty() (in case of shape-only model!), then the vertex colour is no
            // longer set to gray. But we don't want that here, maybe we only want texturing, then we don't
            // need vertex-colours at all. We can do it in a custom VertexShader if needed.
        }

        // All vertices are in clip-space now. Prepare the rasterisation stage:
        vector<Triangle<T>> triangles_to_raster;
        const auto& tti = mesh.tti.empty() ? mesh.tvi : mesh.tti; // If tti is not empty, we'll use it, otherwise,
                                                                  // use tvi for texturing.

        // In the loop further below, we're building a list of triangles to render, and will be indexing into
        // Mesh::colors. But that array is not available for meshes without per-vertex colouring. So we'll use
        // the below lambda which either returns the colours for the vertex, or an empty vector.
        const auto get_color_or_zero = [](const std::vector<Eigen::Vector3f>& mesh_colors, int vertex_index) {
            if (mesh_colors.size() > 0)
            {
                return mesh_colors[vertex_index];
            } else
            {
                return Eigen::Vector3f(0.0f, 0.0f, 0.0f);
            }
        };

        // This builds the (one and final) triangles to render. Meaning: The triangles formed of mesh.tvi (the
        // ones that survived the clip/culling), plus possibly more that intersect one of the frustum planes
        // (i.e. this can generate new triangles with new pos/vc/texcoords).
        for (std::size_t tri_index = 0; tri_index < mesh.tvi.size(); ++tri_index)
        {
            const auto& tri_indices = mesh.tvi[tri_index];
            const auto& tri_tc_indices = tti[tri_index];
            unsigned char visibility_bits[3];
            for (unsigned char k = 0; k < 3; k++)
            {
                visibility_bits[k] = 0;
                const auto x_cc = clipspace_vertices[tri_indices[k]].x();
                const auto y_cc = clipspace_vertices[tri_indices[k]].y();
                const auto z_cc = clipspace_vertices[tri_indices[k]].z();
                const auto w_cc = clipspace_vertices[tri_indices[k]].w();
                if (x_cc < -w_cc) // true if outside of view frustum. False if on or inside the plane.
                    visibility_bits[k] |= 1; // set bit if outside of frustum
                if (x_cc > w_cc)
                    visibility_bits[k] |= 2;
                if (y_cc < -w_cc)
                    visibility_bits[k] |= 4;
                if (y_cc > w_cc)
                    visibility_bits[k] |= 8;
                if (enable_near_clipping && z_cc < -w_cc) // near plane frustum clipping
                    visibility_bits[k] |= 16;
                if (rasterizer.enable_far_clipping && z_cc > w_cc) // far plane frustum clipping
                    visibility_bits[k] |= 32;
            } // if all bits are 0, then it's inside the frustum
            // all vertices are not visible - reject the triangle.
            if ((visibility_bits[0] & visibility_bits[1] & visibility_bits[2]) > 0)
            {
                continue;
            }
            // all vertices are visible - pass the whole triangle to the rasteriser. = All bits of all 3
            // triangles are 0.
            if ((visibility_bits[0] | visibility_bits[1] | visibility_bits[2]) == 0)
            {
                // relevant part of process_prospective_tri:
                std::array<Eigen::Vector4<T>, 3> prospective_tri{
                    divide_by_w(clipspace_vertices[tri_indices[0]]),
                    divide_by_w(clipspace_vertices[tri_indices[1]]),
                    divide_by_w(clipspace_vertices[tri_indices[2]])};
                // We have a prospective tri in NDC coords now, with its vertices having coords [x_ndc, y_ndc,
                // z_ndc, 1/w_clip].

                // Replaces x and y of the NDC coords with the screen coords. Keep z and w the same.
                const Eigen::Vector2<T> v0_screen =
                    clip_to_screen_space(prospective_tri[0].x(), prospective_tri[0].y(),
                                         rasterizer.viewport_width, rasterizer.viewport_height);
                prospective_tri[0].x() = v0_screen.x();
                prospective_tri[0].y() = v0_screen.y();
                const Eigen::Vector2<T> v1_screen =
                    clip_to_screen_space(prospective_tri[1].x(), prospective_tri[1].y(),
                                         rasterizer.viewport_width, rasterizer.viewport_height);
                prospective_tri[1].x() = v1_screen.x();
                prospective_tri[1].y() = v1_screen.y();
                const Eigen::Vector2<T> v2_screen =
                    clip_to_screen_space(prospective_tri[2].x(), prospective_tri[2].y(),
                                         rasterizer.viewport_width, rasterizer.viewport_height);
                prospective_tri[2].x() = v2_screen.x();
                prospective_tri[2].y() = v2_screen.y();

                // Culling (front/back/none - or what are OpenGL's modes?). Do we do any culling
                // elsewhere? No?
                if (enable_backface_culling)
                {
                    // Note/Todo: Isn't this just v0_screen, etc.? Let's assume for now it is. So before, we had here:
                    // prospective_tri[0], [1], [2], but we only need their x and y coords.
                    if (!detail::are_vertices_ccw_in_screen_space(
                            Eigen::Vector2<T>(prospective_tri[0].x(), prospective_tri[0].y()),
                            Eigen::Vector2<T>(prospective_tri[1].x(), prospective_tri[1].y()),
                            Eigen::Vector2<T>(prospective_tri[2].x(), prospective_tri[2].y())))
                        continue;
                }

                // Get the bounding box of the triangle:
                const auto boundingBox = detail::calculate_clipped_bounding_box(
                    Eigen::Vector2<T>(prospective_tri[0].x(), prospective_tri[0].y()),
                    Eigen::Vector2<T>(prospective_tri[1].x(), prospective_tri[1].y()),
                    Eigen::Vector2<T>(prospective_tri[2].x(), prospective_tri[2].y()),
                    rasterizer.viewport_width, rasterizer.viewport_height);
                const auto min_x = boundingBox.x;
                const auto max_x = boundingBox.x + boundingBox.width;
                const auto min_y = boundingBox.y;
                const auto max_y = boundingBox.y + boundingBox.height;
                if (max_x <= min_x || max_y <= min_y)
                { // Note: Can the width/height of the bbox be negative? Maybe we only need to check for
                    // equality here?
                    continue;
                }

                // If we're here, the triangle is CCW in screen space and the bbox is inside the viewport!
                triangles_to_raster.push_back(Triangle<T>{
                    detail::Vertex<T>{prospective_tri[0], get_color_or_zero(mesh.colors, tri_indices[0]),
                                         Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[0]](0),
                                                          mesh.texcoords[tri_tc_indices[0]](1))},
                    detail::Vertex<T>{prospective_tri[1], get_color_or_zero(mesh.colors, tri_indices[1]),
                                         Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[1]](0),
                                                          mesh.texcoords[tri_tc_indices[1]](1))},
                    detail::Vertex<T>{prospective_tri[2], get_color_or_zero(mesh.colors, tri_indices[2]),
                                         Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[2]](0),
                                                          mesh.texcoords[tri_tc_indices[2]](1))}});
                continue; // Triangle was either added or not added. Continue with next triangle.
            }
            // At this point, the triangle is known to be intersecting one of the view frustum's planes
            // Note: It seems that this is only w.r.t. the near-plane. If a triangle is partially outside the
            // tlbr viewport, it'll get rejected.
            // Well, 'z' of these triangles seems to be -1, so is that really the near plane?
            std::vector<detail::Vertex<T>> vertices;
            vertices.reserve(3);
            vertices.push_back(detail::Vertex<T>{clipspace_vertices[tri_indices[0]],
                                                    get_color_or_zero(mesh.colors, tri_indices[0]),
                                                 Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[0]](0),
                                                                     mesh.texcoords[tri_tc_indices[0]](1))});
            vertices.push_back(detail::Vertex<T>{clipspace_vertices[tri_indices[1]],
                                                    get_color_or_zero(mesh.colors, tri_indices[1]),
                                                 Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[1]](0),
                                                                     mesh.texcoords[tri_tc_indices[1]](1))});
            vertices.push_back(detail::Vertex<T>{clipspace_vertices[tri_indices[2]],
                                                    get_color_or_zero(mesh.colors, tri_indices[2]),
                                                 Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[2]](0),
                                                                     mesh.texcoords[tri_tc_indices[2]](1))});
            // split the triangle if it intersects the near plane:
            if (enable_near_clipping)
            {
                vertices = clip_polygon_to_plane_in_4d(
                    vertices, Eigen::Vector4<T>(T(0.0), T(0.0), T(-1.0),
                                               T(-1.0))); // "Normal" (or "4D hyperplane") of the near-plane.
                                                          // I tested it and it works like this but I'm a
                                                          // little bit unsure because Songho says the normal
                                                          // of the near-plane is (0,0,-1,1) (maybe I have to
                                                          // switch around the < 0 checks in the function?)
            }

            // Triangulation of the polygon formed of the 'vertices' array:
            if (vertices.size() >= 3)
            {
                for (unsigned char k = 0; k < vertices.size() - 2; k++)
                {
                    // Build a triangle from vertices[0], vertices[1 + k], vertices[2 + k]:
                    // Add to triangles_to_raster if it passed culling etc.
                    // TODO: This does the same as above - the code is copied 1:1. Avoid!
                    // COPY START (but init of prospective_tri is changed, as well as init of 't'.)
                    std::array<Eigen::Vector4<T>, 3> prospective_tri{divide_by_w(vertices[0].position),
                                                                    divide_by_w(vertices[1 + k].position),
                                                                    divide_by_w(vertices[2 + k].position)};

                    const Eigen::Vector2<T> v0_screen =
                        clip_to_screen_space(prospective_tri[0].x(), prospective_tri[0].y(),
                                             rasterizer.viewport_width, rasterizer.viewport_height);
                    prospective_tri[0].x() = v0_screen.x();
                    prospective_tri[0].y() = v0_screen.y();
                    const Eigen::Vector2<T> v1_screen =
                        clip_to_screen_space(prospective_tri[1].x(), prospective_tri[1].y(),
                                             rasterizer.viewport_width, rasterizer.viewport_height);
                    prospective_tri[1].x() = v1_screen.x();
                    prospective_tri[1].y() = v1_screen.y();
                    const Eigen::Vector2<T> v2_screen =
                        clip_to_screen_space(prospective_tri[2].x(), prospective_tri[2].y(),
                                             rasterizer.viewport_width, rasterizer.viewport_height);
                    prospective_tri[2].x() = v2_screen.x();
                    prospective_tri[2].y() = v2_screen.y();

                    if (enable_backface_culling)
                    {
                        if (!detail::are_vertices_ccw_in_screen_space(
                                Eigen::Vector2<T>(prospective_tri[0].x(), prospective_tri[0].y()),
                                Eigen::Vector2<T>(prospective_tri[1].x(), prospective_tri[1].y()),
                                Eigen::Vector2<T>(prospective_tri[2].x(), prospective_tri[2].y())))
                            continue;
                    }

                    const auto boundingBox = detail::calculate_clipped_bounding_box(
                        Eigen::Vector2<T>(prospective_tri[0].x(), prospective_tri[0].y()),
                        Eigen::Vector2<T>(prospective_tri[1].x(), prospective_tri[1].y()),
                        Eigen::Vector2<T>(prospective_tri[2].x(), prospective_tri[2].y()),
                        rasterizer.viewport_width, rasterizer.viewport_height);
                    const auto min_x = boundingBox.x;
                    const auto max_x = boundingBox.x + boundingBox.width;
                    const auto min_y = boundingBox.y;
                    const auto max_y = boundingBox.y + boundingBox.height;
                    if (max_x <= min_x || max_y <= min_y)
                    {
                        continue;
                    }

                    // If we're here, the triangle is CCW in screen space and the bbox is inside the viewport!
                    triangles_to_raster.push_back(Triangle<T>{
                        detail::Vertex<T>{prospective_tri[0], vertices[0].color, vertices[0].texcoords},
                        detail::Vertex<T>{prospective_tri[1], vertices[1 + k].color,
                                             vertices[1 + k].texcoords},
                        detail::Vertex<T>{prospective_tri[2], vertices[2 + k].color,
                                             vertices[2 + k].texcoords}});
                    // continue; // triangle was either added or not added. Continue with next triangle.
                    // COPY END
                }
            }

        } // end of loop over all triangles

        // Each triangle contains [x_screen, y_screen, z_ndc, 1/w_clip].
        // We may have more triangles than in the original mesh.

        // Raster each triangle and apply the fragment shader on each pixel:
        for (const auto& tri : triangles_to_raster)
        {
            rasterizer.raster_triangle(tri[0], tri[1], tri[2], texture);
        }
        return rasterizer.colorbuffer;
    }